

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre_regex.cpp
# Opt level: O2

void __thiscall booster::regex::data::data(data *this,data *other)

{
  size_t sVar1;
  size_t sVar2;
  pcre *ppVar3;
  undefined8 *puVar4;
  
  std::__cxx11::string::string((string *)this,(string *)other);
  this->flags = other->flags;
  this->re = (pcre *)0x0;
  this->are = (pcre *)0x0;
  sVar1 = other->re_size;
  sVar2 = other->are_size;
  this->re_size = sVar1;
  this->are_size = sVar2;
  this->match_size = other->match_size;
  if (other->re != (pcre *)0x0) {
    ppVar3 = (pcre *)(*_pcre_malloc)(sVar1);
    this->re = ppVar3;
    if (ppVar3 == (pcre *)0x0) goto LAB_001af265;
    memcpy(ppVar3,other->re,this->re_size);
  }
  if (other->are == (pcre *)0x0) {
    return;
  }
  ppVar3 = (pcre *)(*_pcre_malloc)(this->are_size);
  this->are = ppVar3;
  if (ppVar3 != (pcre *)0x0) {
    memcpy(ppVar3,other->are,this->are_size);
    return;
  }
LAB_001af265:
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = pthread_rwlock_rdlock;
  __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

data(data const &other) :
			expression(other.expression),
			flags(other.flags),
			re(0),
			are(0),
			re_size(other.re_size),
			are_size(other.are_size),
			match_size(other.match_size)
		{
			try {
				if(other.re!=0) {
					re = (pcre *)(pcre_malloc(re_size));
					if(!re) {
						throw std::bad_alloc();
					}
					memcpy(re,other.re,re_size);
				}
				if(other.are!=0) {
					are = (pcre *)(pcre_malloc(are_size));
					if(!are) {
						throw std::bad_alloc();
					}
					memcpy(are,other.are,are_size);
				}
			}
			catch(...) {
				if(re) pcre_free(re);
				if(are) pcre_free(are);
				throw;
			}
		}